

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O0

int Cec_ManSimClassesRefine(Cec_ManSim_t *p)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  float fVar3;
  int local_1c;
  int i;
  Cec_ManSim_t *p_local;
  
  Gia_ManCreateValueRefs(p->pAig);
  p->nWords = p->pPars->nWords;
  local_1c = 0;
  while( true ) {
    if (p->pPars->nRounds <= local_1c) {
      if (p->pPars->fVerbose != 0) {
        pGVar1 = p->pAig;
        fVar3 = Cec_MemUsage(p);
        Gia_ManEquivPrintClasses(pGVar1,0,fVar3);
      }
      return 0;
    }
    if ((local_1c % (p->pPars->nRounds / 5) == 0) && (p->pPars->fVerbose != 0)) {
      pGVar1 = p->pAig;
      fVar3 = Cec_MemUsage(p);
      Gia_ManEquivPrintClasses(pGVar1,0,fVar3);
    }
    Cec_ManSimCreateInfo(p,p->vCiSimInfo,p->vCoSimInfo);
    iVar2 = Cec_ManSimSimulateRound(p,p->vCiSimInfo,p->vCoSimInfo);
    if (iVar2 != 0) break;
    local_1c = local_1c + 1;
  }
  return 1;
}

Assistant:

int Cec_ManSimClassesRefine( Cec_ManSim_t * p )
{
    int i;
    Gia_ManCreateValueRefs( p->pAig );
    p->nWords = p->pPars->nWords;
    for ( i = 0; i < p->pPars->nRounds; i++ )
    {
        if ( (i % (p->pPars->nRounds / 5)) == 0 && p->pPars->fVerbose )
            Gia_ManEquivPrintClasses( p->pAig, 0, Cec_MemUsage(p) );
        Cec_ManSimCreateInfo( p, p->vCiSimInfo, p->vCoSimInfo );
        if ( Cec_ManSimSimulateRound( p, p->vCiSimInfo, p->vCoSimInfo ) )
            return 1;
    }
    if ( p->pPars->fVerbose )
        Gia_ManEquivPrintClasses( p->pAig, 0, Cec_MemUsage(p) );
    return 0;
}